

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

void dpfb::args::printHelp(char *progName)

{
  printf(help,dpfbVersion,progName,codePoints,(ulong)fontDpi,fontExportFormat,(ulong)fontSize,
         fontRenderer,hinting,imageFormat,(ulong)imageMaxCount,(ulong)imageMaxSize,imageSizeMode);
  puts("Font export formats (-font-export-format):");
  listPlugins<dpfb::FontWriter>();
  puts("Font renderers (-font-renderer):");
  listPlugins<dpfb::FontRendererCreator>();
  puts("Image formats (-image-format):");
  listPlugins<dpfb::ImageWriter>();
  return;
}

Assistant:

static void printHelp(const char* progName)
{
    std::printf(
        help,
        dpfbVersion,
        progName,
        codePoints,
        fontDpi, fontExportFormat, fontSize, fontRenderer,
        hinting,
        imageFormat,
        imageMaxCount, imageMaxSize, imageSizeMode);

    std::printf("Font export formats (-font-export-format):\n");
    listPlugins<FontWriter>();

    std::printf("Font renderers (-font-renderer):\n");
    listPlugins<FontRendererCreator>();

    std::printf("Image formats (-image-format):\n");
    listPlugins<ImageWriter>();
}